

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O1

int ffpkyl(fitsfile *fptr,char *keyname,int value,char *comm,int *status)

{
  char valstring [71];
  char card [81];
  undefined2 local_c8 [40];
  char local_78 [96];
  
  if (0 < *status) {
    return *status;
  }
  local_c8[0] = 0x54;
  if (value == 0) {
    local_c8[0] = 0x46;
  }
  ffmkky(keyname,(char *)local_c8,comm,local_78,status);
  ffprec(fptr,local_78,status);
  return *status;
}

Assistant:

int ffpkyl( fitsfile *fptr,     /* I - FITS file pointer        */
            const char *keyname,/* I - name of keyword to write */
            int  value,         /* I - keyword value            */
            const char *comm,   /* I - keyword comment          */
            int  *status)       /* IO - error status            */
/*
  Write (put) the keyword, value and comment into the FITS header.
  Values equal to 0 will result in a False FITS keyword; any other
  non-zero value will result in a True FITS keyword.
*/
{
    char valstring[FLEN_VALUE];
    char card[FLEN_CARD];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    ffl2c(value, valstring, status);   /* convert to formatted string */
    ffmkky(keyname, valstring, comm, card, status);  /* construct the keyword*/
    ffprec(fptr, card, status);  /* write the keyword*/

    return(*status);
}